

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

void ngx_http_keepalive_handler(ngx_event_t *rev)

{
  ngx_connection_t *c_00;
  ngx_buf_t *pnVar1;
  ngx_log_t *log;
  size_t size_00;
  u_char *puVar2;
  int *piVar3;
  ssize_t sVar4;
  ngx_int_t nVar5;
  ngx_http_request_t *pnVar6;
  ngx_connection_t *c;
  ngx_buf_t *b;
  ssize_t n;
  size_t size;
  ngx_event_t *rev_local;
  
  c_00 = (ngx_connection_t *)rev->data;
  if ((c_00->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,c_00->log,0,"http keepalive handler");
  }
  if (((*(uint *)&rev->field_0x8 >> 10 & 1) == 0) && ((*(uint *)&c_00->field_0xd8 >> 0x10 & 1) == 0)
     ) {
    pnVar1 = c_00->buffer;
    size_00 = (long)pnVar1->end - (long)pnVar1->start;
    if (pnVar1->pos == (u_char *)0x0) {
      puVar2 = (u_char *)ngx_palloc(c_00->pool,size_00);
      pnVar1->pos = puVar2;
      if (pnVar1->pos == (u_char *)0x0) {
        ngx_http_close_connection(c_00);
        return;
      }
      pnVar1->start = pnVar1->pos;
      pnVar1->last = pnVar1->pos;
      pnVar1->end = pnVar1->pos + size_00;
    }
    *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xfffff8ff | 0x300;
    piVar3 = __errno_location();
    *piVar3 = 0;
    sVar4 = (*c_00->recv)(c_00,pnVar1->last,size_00);
    *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xfffff8ff | 0x200;
    if (sVar4 == -2) {
      nVar5 = ngx_handle_read_event(rev,0);
      if (nVar5 == 0) {
        nVar5 = ngx_pfree(c_00->pool,pnVar1->start);
        if (nVar5 == 0) {
          pnVar1->pos = (u_char *)0x0;
        }
      }
      else {
        ngx_http_close_connection(c_00);
      }
    }
    else if (sVar4 == -1) {
      ngx_http_close_connection(c_00);
    }
    else {
      c_00->log->handler = (ngx_log_handler_pt)0x0;
      if (sVar4 == 0) {
        if (6 < c_00->log->log_level) {
          log = c_00->log;
          piVar3 = __errno_location();
          ngx_log_error_core(7,log,*piVar3,"client %V closed keepalive connection",&c_00->addr_text)
          ;
        }
        ngx_http_close_connection(c_00);
      }
      else {
        pnVar1->last = pnVar1->last + sVar4;
        c_00->log->handler = ngx_http_log_error;
        c_00->log->action = "reading client request line";
        *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xffffbfff;
        ngx_reusable_connection(c_00,0);
        pnVar6 = ngx_http_create_request(c_00);
        c_00->data = pnVar6;
        if (c_00->data == (void *)0x0) {
          ngx_http_close_connection(c_00);
        }
        else {
          c_00->sent = 0;
          *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xffffdfff;
          ngx_event_del_timer(rev);
          rev->handler = ngx_http_process_request_line;
          ngx_http_process_request_line(rev);
        }
      }
    }
  }
  else {
    ngx_http_close_connection(c_00);
  }
  return;
}

Assistant:

static void
ngx_http_keepalive_handler(ngx_event_t *rev)
{
    size_t             size;
    ssize_t            n;
    ngx_buf_t         *b;
    ngx_connection_t  *c;

    c = rev->data;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0, "http keepalive handler");

    if (rev->timedout || c->close) {
        ngx_http_close_connection(c);
        return;
    }

#if (NGX_HAVE_KQUEUE)

    if (ngx_event_flags & NGX_USE_KQUEUE_EVENT) {
        if (rev->pending_eof) {
            c->log->handler = NULL;
            ngx_log_error(NGX_LOG_INFO, c->log, rev->kq_errno,
                          "kevent() reported that client %V closed "
                          "keepalive connection", &c->addr_text);
#if (NGX_HTTP_SSL)
            if (c->ssl) {
                c->ssl->no_send_shutdown = 1;
            }
#endif
            ngx_http_close_connection(c);
            return;
        }
    }

#endif

    b = c->buffer;
    size = b->end - b->start;

    if (b->pos == NULL) {

        /*
         * The c->buffer's memory was freed by ngx_http_set_keepalive().
         * However, the c->buffer->start and c->buffer->end were not changed
         * to keep the buffer size.
         */

        b->pos = ngx_palloc(c->pool, size);
        if (b->pos == NULL) {
            ngx_http_close_connection(c);
            return;
        }

        b->start = b->pos;
        b->last = b->pos;
        b->end = b->pos + size;
    }

    /*
     * MSIE closes a keepalive connection with RST flag
     * so we ignore ECONNRESET here.
     */

    c->log_error = NGX_ERROR_IGNORE_ECONNRESET;
    ngx_set_socket_errno(0);

    n = c->recv(c, b->last, size);
    c->log_error = NGX_ERROR_INFO;

    if (n == NGX_AGAIN) {
        if (ngx_handle_read_event(rev, 0) != NGX_OK) {
            ngx_http_close_connection(c);
            return;
        }

        /*
         * Like ngx_http_set_keepalive() we are trying to not hold
         * c->buffer's memory for a keepalive connection.
         */

        if (ngx_pfree(c->pool, b->start) == NGX_OK) {

            /*
             * the special note that c->buffer's memory was freed
             */

            b->pos = NULL;
        }

        return;
    }

    if (n == NGX_ERROR) {
        ngx_http_close_connection(c);
        return;
    }

    c->log->handler = NULL;

    if (n == 0) {
        ngx_log_error(NGX_LOG_INFO, c->log, ngx_socket_errno,
                      "client %V closed keepalive connection", &c->addr_text);
        ngx_http_close_connection(c);
        return;
    }

    b->last += n;

    c->log->handler = ngx_http_log_error;
    c->log->action = "reading client request line";

    c->idle = 0;
    ngx_reusable_connection(c, 0);

    c->data = ngx_http_create_request(c);
    if (c->data == NULL) {
        ngx_http_close_connection(c);
        return;
    }

    c->sent = 0;
    c->destroyed = 0;

    ngx_del_timer(rev);

    rev->handler = ngx_http_process_request_line;
    ngx_http_process_request_line(rev);
}